

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAlloc *alloc)

{
  int iVar1;
  CLzRef *pCVar2;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int in_R8D;
  size_t numSons;
  size_t newSize;
  UInt32 hs;
  UInt32 newCyclicBufferSize;
  UInt32 sizeReserv;
  ISzAlloc *in_stack_ffffffffffffffb8;
  CMatchFinder *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar3;
  
  if (0xe0000000 < in_ESI) {
    MatchFinder_Free(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    return 0;
  }
  *(uint *)(in_RDI + 0x54) = in_ESI + in_EDX + 1;
  *(int *)(in_RDI + 0x58) = in_ECX + in_R8D;
  iVar1 = LzInWindow_Create((CMatchFinder *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (UInt32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                            in_stack_ffffffffffffffb8);
  if (iVar1 != 0) {
    *(int *)(in_RDI + 0x24) = in_ECX;
    *(undefined4 *)(in_RDI + 0x6c) = 0;
    if (*(int *)(in_RDI + 0x5c) == 2) {
      uVar3 = 0xffff;
    }
    else {
      uVar3 = in_ESI - 1 >> 1 | in_ESI - 1;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = (uVar3 >> 8 | uVar3) >> 1 | 0xffff;
      if (0x1000000 < uVar3) {
        if (*(int *)(in_RDI + 0x5c) == 3) {
          uVar3 = 0xffffff;
        }
        else {
          uVar3 = uVar3 >> 1;
        }
      }
    }
    *(uint *)(in_RDI + 0x38) = uVar3;
    if (2 < *(uint *)(in_RDI + 0x5c)) {
      *(int *)(in_RDI + 0x6c) = *(int *)(in_RDI + 0x6c) + 0x400;
    }
    if (3 < *(uint *)(in_RDI + 0x5c)) {
      *(int *)(in_RDI + 0x6c) = *(int *)(in_RDI + 0x6c) + 0x10000;
    }
    if (4 < *(uint *)(in_RDI + 0x5c)) {
      *(int *)(in_RDI + 0x6c) = *(int *)(in_RDI + 0x6c) + 0x100000;
    }
    uVar3 = *(int *)(in_RDI + 0x6c) + uVar3 + 1;
    *(uint *)(in_RDI + 0x68) = in_ESI;
    *(uint *)(in_RDI + 0x70) = uVar3;
    *(uint *)(in_RDI + 0x1c) = in_ESI + 1;
    in_stack_ffffffffffffffb8 = (ISzAlloc *)(ulong)(in_ESI + 1);
    if (*(char *)(in_RDI + 0x21) != '\0') {
      in_stack_ffffffffffffffb8 = (ISzAlloc *)((long)in_stack_ffffffffffffffb8 << 1);
    }
    in_stack_ffffffffffffffc0 =
         (CMatchFinder *)((long)&in_stack_ffffffffffffffb8->Alloc + (ulong)uVar3);
    if ((*(long *)(in_RDI + 0x28) != 0) &&
       (*(CMatchFinder **)(in_RDI + 0x478) == in_stack_ffffffffffffffc0)) {
      return 1;
    }
    MatchFinder_FreeThisClassMemory(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(CMatchFinder **)(in_RDI + 0x478) = in_stack_ffffffffffffffc0;
    pCVar2 = AllocRefs(CONCAT44(uVar3,in_stack_ffffffffffffffc8),
                       (ISzAlloc *)in_stack_ffffffffffffffc0);
    *(CLzRef **)(in_RDI + 0x28) = pCVar2;
    if (*(long *)(in_RDI + 0x28) != 0) {
      *(ulong *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x28) + (ulong)*(uint *)(in_RDI + 0x70) * 4;
      return 1;
    }
  }
  MatchFinder_Free(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAlloc *alloc)
{
  UInt32 sizeReserv;
  
  if (historySize > kMaxHistorySize)
  {
    MatchFinder_Free(p, alloc);
    return 0;
  }
  
  sizeReserv = historySize >> 1;
       if (historySize >= ((UInt32)3 << 30)) sizeReserv = historySize >> 3;
  else if (historySize >= ((UInt32)2 << 30)) sizeReserv = historySize >> 2;
  
  sizeReserv += (keepAddBufferBefore + matchMaxLen + keepAddBufferAfter) / 2 + (1 << 19);

  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  
  /* we need one additional byte, since we use MoveBlock after pos++ and before dictionary using */
  
  if (LzInWindow_Create(p, sizeReserv, alloc))
  {
    UInt32 newCyclicBufferSize = historySize + 1;
    UInt32 hs;
    p->matchMaxLen = matchMaxLen;
    {
      p->fixedHashSize = 0;
      if (p->numHashBytes == 2)
        hs = (1 << 16) - 1;
      else
      {
        hs = historySize - 1;
        hs |= (hs >> 1);
        hs |= (hs >> 2);
        hs |= (hs >> 4);
        hs |= (hs >> 8);
        hs >>= 1;
        hs |= 0xFFFF; /* don't change it! It's required for Deflate */
        if (hs > (1 << 24))
        {
          if (p->numHashBytes == 3)
            hs = (1 << 24) - 1;
          else
            hs >>= 1;
          /* if (bigHash) mode, GetHeads4b() in LzFindMt.c needs (hs >= ((1 << 24) - 1))) */
        }
      }
      p->hashMask = hs;
      hs++;
      if (p->numHashBytes > 2) p->fixedHashSize += kHash2Size;
      if (p->numHashBytes > 3) p->fixedHashSize += kHash3Size;
      if (p->numHashBytes > 4) p->fixedHashSize += kHash4Size;
      hs += p->fixedHashSize;
    }

    {
      size_t newSize;
      size_t numSons;
      p->historySize = historySize;
      p->hashSizeSum = hs;
      p->cyclicBufferSize = newCyclicBufferSize;
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hs + numSons;

      if (p->hash && p->numRefs == newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + p->hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}